

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

void __thiscall ON_SubDQuadNeighborhood::SetPatchStatus(ON_SubDQuadNeighborhood *this,uint fvi0)

{
  byte bVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDVertex *this_00;
  ON_SubDVertex *this_01;
  ON_SubDVertex *this_02;
  ON_SubDEdge *pOVar3;
  ON_SubDEdge *this_03;
  int iVar4;
  ON_2dex max_face_grid_dex_00;
  ON_2dex min_face_grid_dex_00;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ON_SubDFace *pOVar8;
  uint uVar9;
  ON_SubDEdge *(*papOVar10) [2];
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint i;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uchar uVar17;
  double dVar18;
  char acStack_a0 [4];
  bool bExtraordinaryCornerVertex [4];
  bool local_98 [4];
  bool bCenterEdgeIsSmooth [4];
  bool bCenterEdgeIsCrease [4];
  bool bQuadVertexIsSmoothOrCrease [4];
  uint local_88;
  uint local_80;
  ON_2dex max_face_grid_dex;
  ON_2dex min_face_grid_dex;
  ON_SubDVertex *quad_vertex [4];
  
  this->m_bIsCubicPatch = false;
  iVar16 = (uint)this->m_current_subdivision_level - (uint)this->m_initial_subdivision_level;
  if (this->m_current_subdivision_level <= this->m_initial_subdivision_level) {
    iVar16 = 0;
  }
  ON_2dex::ON_2dex(&min_face_grid_dex,0,0);
  ON_2dex::ON_2dex(&max_face_grid_dex,3,3);
  this->m_boundary_crease_count = '\0';
  uVar17 = this->m_bBoundaryCrease[0] == true;
  if ((bool)uVar17) {
    this->m_boundary_crease_count = '\x01';
    min_face_grid_dex.j = min_face_grid_dex.j + 1;
  }
  if (this->m_bBoundaryCrease[1] == true) {
    uVar17 = uVar17 + '\x01';
    this->m_boundary_crease_count = uVar17;
    max_face_grid_dex.i = max_face_grid_dex.i + -1;
  }
  if (this->m_bBoundaryCrease[2] == true) {
    uVar17 = uVar17 + '\x01';
    this->m_boundary_crease_count = uVar17;
    max_face_grid_dex.j = max_face_grid_dex.j + -1;
  }
  if (this->m_bBoundaryCrease[3] == true) {
    this->m_boundary_crease_count = uVar17 + '\x01';
    min_face_grid_dex.i = min_face_grid_dex.i + 1;
  }
  uVar12 = fvi0 + 1 & 3;
  uVar9 = fvi0 & 3 ^ 2;
  bCenterEdgeIsSmooth[0] = false;
  bCenterEdgeIsSmooth[1] = false;
  bCenterEdgeIsSmooth[2] = false;
  bCenterEdgeIsSmooth[3] = false;
  uVar11 = fvi0 - 1 & 3;
  bVar5 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[fvi0]);
  bCenterEdgeIsSmooth[fvi0] = bVar5;
  if (iVar16 == 0) {
    bVar5 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar12]);
    bCenterEdgeIsSmooth[uVar12] = bVar5;
    bVar5 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar9]);
  }
  else {
    bCenterEdgeIsSmooth[uVar12] = true;
    bVar5 = true;
  }
  bCenterEdgeIsSmooth[uVar9] = bVar5;
  bVar5 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar11]);
  bCenterEdgeIsCrease[0] = false;
  bCenterEdgeIsCrease[1] = false;
  bCenterEdgeIsCrease[2] = false;
  bCenterEdgeIsCrease[3] = false;
  bCenterEdgeIsSmooth[uVar11] = bVar5;
  if (bCenterEdgeIsSmooth[fvi0] == false) {
    bVar6 = ON_SubDEdge::IsCrease(this->m_center_edges[fvi0]);
  }
  else {
    bVar6 = false;
  }
  bCenterEdgeIsCrease[fvi0] = bVar6;
  if (iVar16 == 0) {
    bVar6 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar12]);
    bCenterEdgeIsCrease[uVar12] = bVar6;
    bVar6 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar9]);
  }
  else {
    bCenterEdgeIsCrease[uVar12] = false;
    bVar6 = false;
  }
  bCenterEdgeIsCrease[uVar9] = bVar6;
  if (bVar5) {
    bVar5 = false;
  }
  else {
    bVar5 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar11]);
  }
  bCenterEdgeIsCrease[uVar11] = bVar5;
  uVar15 = 0;
  do {
    uVar7 = uVar15;
    if (((uVar7 == 4) || (this->m_center_edges[uVar7] == (ON_SubDEdge *)0x0)) ||
       (this->m_center_edges[uVar7]->m_edge_tag == SmoothX)) break;
    uVar15 = uVar7 + 1;
  } while (bCenterEdgeIsSmooth[uVar7] != bCenterEdgeIsCrease[uVar7]);
  this->m_sharp_edge_count = '\0';
  local_98[0] = false;
  local_98[1] = false;
  local_98[2] = false;
  local_98[3] = false;
  lVar13 = -8;
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    if ((this->m_center_edges[lVar14] != (ON_SubDEdge *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar14]), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      local_98[0] = true;
      local_98[1] = true;
      local_98[2] = true;
      local_98[3] = true;
    }
    pOVar8 = this->m_face_grid[0][lVar13];
    iVar4 = (int)lVar14;
    if ((pOVar8 != (ON_SubDFace *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp((ON_SubDEdge *)pOVar8), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      bCenterEdgeIsSmooth[lVar14 + -4] = true;
      bCenterEdgeIsSmooth[(ulong)(iVar4 + 1U & 3) - 4] = true;
      bCenterEdgeIsSmooth[(ulong)(iVar4 - 1U & 3) - 4] = true;
    }
    if ((this->m_center_edges[lVar13 + -8] != (ON_SubDEdge *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar13 + -8]), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      bCenterEdgeIsSmooth[lVar14 + -4] = true;
      bCenterEdgeIsSmooth[(ulong)(iVar4 + 1U & 3) - 4] = true;
      bCenterEdgeIsSmooth[(ulong)(iVar4 - 1U & 3) - 4] = true;
    }
    lVar13 = lVar13 + 2;
  }
  bExtraordinaryCornerVertex[0] = false;
  bExtraordinaryCornerVertex[1] = false;
  bExtraordinaryCornerVertex[2] = false;
  bExtraordinaryCornerVertex[3] = false;
  bExtraordinaryCornerVertex[fvi0] = true;
  bVar5 = iVar16 == 0 || uVar7 < 4;
  bExtraordinaryCornerVertex[uVar12] = bVar5;
  bExtraordinaryCornerVertex[uVar9] = bVar5;
  bExtraordinaryCornerVertex[uVar11] = bExtraordinaryCornerVertex[uVar12];
  pOVar2 = this->m_vertex_grid[1][1];
  quad_vertex[0] = pOVar2;
  this_00 = this->m_vertex_grid[2][1];
  quad_vertex[1] = this_00;
  this_01 = this->m_vertex_grid[2][2];
  quad_vertex[2] = this_01;
  this_02 = this->m_vertex_grid[1][2];
  quad_vertex[3] = this_02;
  lVar13 = 0;
  while (lVar13 != 4) {
    dVar18 = ON_SubDVertex::VertexSharpness(quad_vertex[lVar13]);
    if (dVar18 <= 0.0) {
      lVar13 = lVar13 + 1;
    }
    else {
      bCenterEdgeIsSmooth[lVar13 + -4] = true;
      bCenterEdgeIsSmooth[(ulong)((uint)(lVar13 + 1) & 3) - 4] = true;
      bCenterEdgeIsSmooth[(ulong)((int)lVar13 - 1U & 3) - 4] = true;
      lVar13 = lVar13 + 1;
    }
  }
  if (uVar7 < 4) {
    local_80 = 0x56;
    local_88 = local_80;
  }
  else {
    bQuadVertexIsSmoothOrCrease[0] = ON_SubDVertex::IsSmoothOrCrease(pOVar2);
    bQuadVertexIsSmoothOrCrease[1] = ON_SubDVertex::IsSmoothOrCrease(this_00);
    bQuadVertexIsSmoothOrCrease[2] = ON_SubDVertex::IsSmoothOrCrease(this_01);
    bQuadVertexIsSmoothOrCrease[3] = ON_SubDVertex::IsSmoothOrCrease(this_02);
    local_88 = 0x56;
    local_80 = 0x56;
    papOVar10 = this->m_edge_grid;
    for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
      if (bExtraordinaryCornerVertex[uVar15] != false) {
        pOVar2 = quad_vertex[uVar15];
        bVar5 = ON_SubDVertex::IsDart(pOVar2);
        if (!bVar5) {
          uVar9 = (uint)uVar15;
          uVar11 = uVar9 + 1 & 3;
          if (bQuadVertexIsSmoothOrCrease[uVar11] != false) {
            uVar12 = uVar9 - 1 & 3;
            if (bQuadVertexIsSmoothOrCrease[uVar12] != false) {
              if ((bCenterEdgeIsSmooth[uVar15] == true) && (bCenterEdgeIsSmooth[uVar12] == true)) {
                bVar5 = IsOrdinarySmoothQuadCornerVertex(pOVar2);
                if (bVar5) {
LAB_006195e0:
                  bExtraordinaryCornerVertex[uVar15] = false;
                }
              }
              else if ((bCenterEdgeIsCrease[uVar15] == true) &&
                      (bCenterEdgeIsSmooth[uVar12] == true)) {
                bVar5 = ON_SubDVertex::IsCrease(pOVar2);
                if (((bVar5) &&
                    (pOVar3 = *(ON_SubDEdge **)
                               ((long)this->m_edge_grid[0] + (ulong)(uVar12 << 4) + 8),
                    pOVar3 != (ON_SubDEdge *)0x0)) && (bVar5 = ON_SubDEdge::IsCrease(pOVar3), bVar5)
                   ) {
LAB_00619677:
                  pOVar8 = SideFace(this,uVar12);
                  if ((pOVar8 != (ON_SubDFace *)0x0) && (pOVar8->m_edge_count == 4))
                  goto LAB_006195e0;
                }
              }
              else if ((bCenterEdgeIsSmooth[uVar15] == false) ||
                      (bCenterEdgeIsCrease[uVar12] != true)) {
                if ((bCenterEdgeIsCrease[uVar15] != false) &&
                   (((bCenterEdgeIsCrease[uVar12] == true &&
                     (((bVar5 = ON_SubDVertex::IsCrease(pOVar2), bVar5 ||
                       (bVar5 = ON_SubDVertex::IsCorner(pOVar2), bVar5)) &&
                      (bVar5 = ON_SubDVertex::IsCrease(quad_vertex[uVar11]), bVar5)))) &&
                    (bVar5 = ON_SubDVertex::IsCrease(quad_vertex[uVar12]), bVar5)))) {
                  bVar5 = IsOrdinarySmoothQuadCornerVertex(quad_vertex[uVar15 ^ 2]);
                  if (bVar5) {
                    pOVar3 = *(ON_SubDEdge **)((long)this->m_edge_grid[0] + (ulong)(uVar11 << 4));
                    this_03 = this->m_edge_grid[uVar15 ^ 2][1];
                    if (((this_03 != (ON_SubDEdge *)0x0 && pOVar3 != (ON_SubDEdge *)0x0) &&
                        (bVar5 = ON_SubDEdge::IsCrease(pOVar3), bVar5)) &&
                       (bVar5 = ON_SubDEdge::IsCrease(this_03), bVar5 && iVar16 != 0)) {
                      bVar5 = ON_SubDVertex::IsCrease(pOVar2);
                      if (bVar5) {
                        bExtraordinaryCornerVertex[uVar15] = false;
                        local_80 = uVar9;
                      }
                      else {
                        bVar5 = ON_SubDVertex::IsCorner(pOVar2);
                        if (bVar5) {
                          local_88 = uVar9;
                        }
                      }
                    }
                  }
                }
              }
              else {
                bVar5 = ON_SubDVertex::IsCrease(pOVar2);
                if (((bVar5) && ((*papOVar10)[0] != (ON_SubDEdge *)0x0)) &&
                   (bVar5 = ON_SubDEdge::IsCrease((*papOVar10)[0]), uVar12 = uVar9, bVar5))
                goto LAB_00619677;
              }
            }
          }
        }
      }
      papOVar10 = papOVar10 + 1;
    }
  }
  this->m_extraordinary_corner_vertex_count = '\0';
  uVar17 = '\0';
  for (lVar13 = 4; lVar13 != 8; lVar13 = lVar13 + 1) {
    bVar5 = (bool)acStack_a0[lVar13];
    this->m_bExtraordinaryCornerVertex[lVar13 + -4] = bVar5;
    if (bVar5 == true) {
      uVar17 = uVar17 + '\x01';
      this->m_extraordinary_corner_vertex_count = uVar17;
    }
  }
  this->m_exact_quadrant_patch_count = '\0';
  bVar1 = this->m_boundary_crease_count;
  uVar17 = '\0';
  for (lVar13 = 3; lVar13 != 7; lVar13 = lVar13 + 1) {
    this->m_bExtraordinaryCornerVertex[lVar13 + 2] = false;
    if ((((bVar1 < 3) &&
         ((uVar9 = (uint)lVar13, local_80 < 4 || bVar1 != 2 ||
          ((local_88 < 4 && ((uVar9 - 3 ^ local_88) == 2)))))) &&
        (bExtraordinaryCornerVertex[lVar13 + 1] == false)) &&
       (((acStack_a0[lVar13 + 1] == '\0' && (bExtraordinaryCornerVertex[uVar9 - 2 & 3] == false)) &&
        (bExtraordinaryCornerVertex[uVar9 & 3] == false)))) {
      this->m_bExtraordinaryCornerVertex[lVar13 + 2] = true;
      uVar17 = uVar17 + '\x01';
      this->m_exact_quadrant_patch_count = uVar17;
    }
  }
  min_face_grid_dex_00.j = min_face_grid_dex.j;
  min_face_grid_dex_00.i = min_face_grid_dex.i;
  max_face_grid_dex_00.j = max_face_grid_dex.j;
  max_face_grid_dex_00.i = max_face_grid_dex.i;
  bVar5 = VertexGridIsExactCubicPatch(this,min_face_grid_dex_00,max_face_grid_dex_00,local_80);
  this->m_bIsCubicPatch = bVar5;
  return;
}

Assistant:

void ON_SubDQuadNeighborhood::SetPatchStatus(
  const unsigned int fvi0
  )
{
  m_bIsCubicPatch = false;

  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned int delta_subdivision_level 
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? ((unsigned int)(m_current_subdivision_level - m_initial_subdivision_level))
    : 0U;

  ON_2dex min_face_grid_dex = { 0, 0 };
  ON_2dex max_face_grid_dex = { 3, 3 };

  m_boundary_crease_count = 0;
  if (m_bBoundaryCrease[0])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.j++;
  }
  if (m_bBoundaryCrease[1])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.i--;
  }
  if (m_bBoundaryCrease[2])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.j--;
  }
  if (m_bBoundaryCrease[3])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.i++;
  }


  const unsigned int fvi1 = (fvi0+1)%4;
  const unsigned int fvi2 = (fvi0+2)%4;
  const unsigned int fvi3 = (fvi0+3)%4;

  bool bCenterEdgeIsSmooth[4] = {};
  bCenterEdgeIsSmooth[fvi0] = m_center_edges[fvi0]->IsSmoothNotX();
  bCenterEdgeIsSmooth[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi3] = m_center_edges[fvi3]->IsSmoothNotX();

  bool bCenterEdgeIsCrease[4] = {};
  bCenterEdgeIsCrease[fvi0] = bCenterEdgeIsSmooth[fvi0] ? false : m_center_edges[fvi0]->IsCrease();
  bCenterEdgeIsCrease[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi3] = bCenterEdgeIsSmooth[fvi3] ? false : m_center_edges[fvi3]->IsCrease();

  bool bEdgeTagX = false;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (
      nullptr != m_center_edges[i]
      && ON_SubDEdgeTag::SmoothX != m_center_edges[i]->m_edge_tag
      && (bCenterEdgeIsSmooth[i] != bCenterEdgeIsCrease[i])
      )
    {
      continue;
    }
    bEdgeTagX = true;
    break;
  }

  m_sharp_edge_count = 0;
  bool bSharpQuadrant[4] = {};
  for(unsigned int i = 0; i < 4; ++i)
  {
    if (nullptr != m_center_edges[i] && m_center_edges[i]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[0] = true;
      bSharpQuadrant[1] = true;
      bSharpQuadrant[2] = true;
      bSharpQuadrant[3] = true;
    }
    if (nullptr != this->m_edge_grid[i][0] && this->m_edge_grid[i][0]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
    if (nullptr != this->m_edge_grid[i][1] && this->m_edge_grid[i][1]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i % 4U] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
  }

  ////////////////////////////////////////////////////////////////////////////
  //
  // Set 
  //  m_bExtraordinaryCornerVertex[], m_extraordinary_corner_vertex_count
  //  m_bExactQuadrantPatch[], and m_exact_quadrant_patch_count
  // 
  unsigned int boundary_crease_corner_index = 86U;
  unsigned int boundary_corner_corner_index = 86U;

  bool bExtraordinaryCornerVertex[4] = {};
  bExtraordinaryCornerVertex[fvi0] = true;
  bExtraordinaryCornerVertex[fvi1] = (0 == delta_subdivision_level || bEdgeTagX);
  bExtraordinaryCornerVertex[fvi2] = bExtraordinaryCornerVertex[fvi1];
  bExtraordinaryCornerVertex[fvi3] = bExtraordinaryCornerVertex[fvi1];


  const ON_SubDVertex* quad_vertex[4] = {
    m_vertex_grid[1][1],
    m_vertex_grid[2][1],
    m_vertex_grid[2][2],
    m_vertex_grid[1][2]
  };

  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    // Dale Lear 2024 Feb 28 Fix RH-80676
    // Even when bSharpQuadrant[corner_index] is true from tests above,
    // we have to call quad_vertex[corner_index]->VertexSharpness() to
    // insure all sharp edges are taken into account.
    if (quad_vertex[corner_index]->VertexSharpness() > 0.0)
    {
      bSharpQuadrant[corner_index] = true;
      bSharpQuadrant[(corner_index + 1U) % 4U] = true;
      bSharpQuadrant[(corner_index + 3U) % 4U] = true;
    }
  }

  if (false == bEdgeTagX)
  {
    const bool bQuadVertexIsSmoothOrCrease[4] =
    {
      quad_vertex[0]->IsSmoothOrCrease(),
      quad_vertex[1]->IsSmoothOrCrease(),
      quad_vertex[2]->IsSmoothOrCrease(),
      quad_vertex[3]->IsSmoothOrCrease()
    };

    for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
    {
      if (false == bExtraordinaryCornerVertex[corner_index])
        continue;

      if (quad_vertex[corner_index]->IsDart())
        continue;

      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+1)%4])
        continue;
      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+3)%4])
        continue;

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (IsOrdinarySmoothQuadCornerVertex(quad_vertex[corner_index]))
          bExtraordinaryCornerVertex[corner_index] = false;
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[(corner_index + 3) % 4][1];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace((corner_index + 3) % 4);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[corner_index][0];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace(corner_index);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (
          (quad_vertex[corner_index]->IsCrease() || quad_vertex[corner_index]->IsCorner())
          && quad_vertex[(corner_index + 1) % 4]->IsCrease()
          && quad_vertex[(corner_index + 3) % 4]->IsCrease()
          && IsOrdinarySmoothQuadCornerVertex(quad_vertex[(corner_index + 2) % 4])
          )
        {
          const ON_SubDEdge* e1 = m_edge_grid[(corner_index + 1) % 4][0];
          const ON_SubDEdge* e2 = m_edge_grid[(corner_index + 2) % 4][1];
          if (nullptr != e1 && nullptr != e2 && e1->IsCrease() && e2->IsCrease())
          {
            if (delta_subdivision_level > 0)
            {
              if (quad_vertex[corner_index]->IsCrease())
              {
                boundary_crease_corner_index = corner_index;
                bExtraordinaryCornerVertex[corner_index] = false;
              }
              else if ( quad_vertex[corner_index]->IsCorner() )
              {
                boundary_corner_corner_index = corner_index;
              }
            }
          }
        }
        continue;
      }

    }
  }

  m_extraordinary_corner_vertex_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExtraordinaryCornerVertex[corner_index] = bExtraordinaryCornerVertex[corner_index];
    if (bExtraordinaryCornerVertex[corner_index])
      m_extraordinary_corner_vertex_count++;
  }

  m_exact_quadrant_patch_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExactQuadrantPatch[corner_index] = false;
    if (m_boundary_crease_count > 2)
      continue;
    if (2 == m_boundary_crease_count)
    {
      if (boundary_crease_corner_index >= 4)
      {
        if ( boundary_corner_corner_index >= 4 || ((boundary_corner_corner_index+2)%4) != corner_index)
          continue;
      }
    }
    if (bSharpQuadrant[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 1) % 4])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 3) % 4])
      continue;
    m_bExactQuadrantPatch[corner_index] = true;
    m_exact_quadrant_patch_count++;
  }

  // Set m_bIsCubicPatch
  m_bIsCubicPatch = VertexGridIsExactCubicPatch(
    min_face_grid_dex,
    max_face_grid_dex,
    boundary_crease_corner_index
    );
}